

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

void __thiscall embree::SceneGraph::SpotLight::SpotLight(SpotLight *this,SpotLight *param_2)

{
  undefined8 uVar1;
  float fVar2;
  
  (this->super_Light).type = (param_2->super_Light).type;
  uVar1 = *(undefined8 *)((long)&(param_2->P).field_0 + 8);
  *(undefined8 *)&(this->P).field_0 = *(undefined8 *)&(param_2->P).field_0;
  *(undefined8 *)((long)&(this->P).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_2->D).field_0 + 8);
  *(undefined8 *)&(this->D).field_0 = *(undefined8 *)&(param_2->D).field_0;
  *(undefined8 *)((long)&(this->D).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_2->I).field_0 + 8);
  *(undefined8 *)&(this->I).field_0 = *(undefined8 *)&(param_2->I).field_0;
  *(undefined8 *)((long)&(this->I).field_0 + 8) = uVar1;
  fVar2 = param_2->angleMax;
  this->angleMin = param_2->angleMin;
  this->angleMax = fVar2;
  return;
}

Assistant:

SpotLight (const Vec3fa& P, const Vec3fa& D, const Vec3fa& I, float angleMin, float angleMax)
        : Light(LIGHT_SPOT), P(P), D(D), I(I), angleMin(angleMin), angleMax(angleMax) {}